

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

pthread_key_t
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::CreateKey(void)

{
  int iVar1;
  pthread_key_t key;
  GTestLog local_10;
  pthread_key_t local_c;
  
  iVar1 = pthread_key_create(&local_c,DeleteThreadLocalValue);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_10,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/GustavHager[P]pig-latinizer/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x821);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"pthread_key_create(&key, &DeleteThreadLocalValue)",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed with error ",0x12);
    std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    GTestLog::~GTestLog(&local_10);
  }
  return local_c;
}

Assistant:

static pthread_key_t CreateKey() {
    pthread_key_t key;
    // When a thread exits, DeleteThreadLocalValue() will be called on
    // the object managed for that thread.
    GTEST_CHECK_POSIX_SUCCESS_(
        pthread_key_create(&key, &DeleteThreadLocalValue));
    return key;
  }